

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_naive_aggregator.cpp
# Opt level: O0

void __thiscall
duckdb::WindowNaiveState::WindowNaiveState
          (WindowNaiveState *this,WindowNaiveAggregator *aggregator_p)

{
  initializer_list<duckdb::LogicalType> iVar1;
  bool bVar2;
  Allocator *allocator;
  Allocator *types;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  idx_t i;
  uchar **fdata;
  data_ptr_t state_ptr;
  idx_t in_stack_000001d8;
  Vector *in_stack_000001e0;
  allocator_type *in_stack_fffffffffffffe28;
  RowLayout *in_stack_fffffffffffffe30;
  iterator in_stack_fffffffffffffe38;
  SelectionVector *in_stack_fffffffffffffe40;
  LogicalTypeId in_stack_fffffffffffffe4f;
  LogicalType *in_stack_fffffffffffffe50;
  undefined8 in_stack_fffffffffffffe58;
  WindowExcludeMode exclude_mode;
  undefined1 ***pppuVar3;
  Vector *in_stack_fffffffffffffe60;
  undefined1 ***pppuVar4;
  LogicalType *in_stack_fffffffffffffe68;
  Vector *in_stack_fffffffffffffe70;
  DataChunk *this_00;
  undefined1 align;
  RowLayout *this_01;
  undefined8 *local_c8 [3];
  undefined1 **local_b0;
  undefined8 local_a8;
  ulong local_88;
  Allocator *local_80;
  allocate_function_ptr_t local_78;
  undefined8 local_10;
  
  exclude_mode = (WindowExcludeMode)((ulong)in_stack_fffffffffffffe58 >> 0x38);
  local_10 = in_RSI;
  WindowAggregatorLocalState::WindowAggregatorLocalState
            ((WindowAggregatorLocalState *)in_stack_fffffffffffffe30);
  *in_RDI = &PTR__WindowNaiveState_03534fa0;
  in_RDI[0xb] = local_10;
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x1a3efc9);
  vector<unsigned_char,_true>::vector
            ((vector<unsigned_char,_true> *)in_stack_fffffffffffffe30,
             (size_type)in_stack_fffffffffffffe28,(allocator_type *)0x1a3efe6);
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x1a3eff5);
  LogicalType::LogicalType(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4f);
  Vector::Vector(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                 (idx_t)in_stack_fffffffffffffe60);
  LogicalType::~LogicalType((LogicalType *)0x1a3f046);
  LogicalType::LogicalType(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4f);
  Vector::Vector(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                 (idx_t)in_stack_fffffffffffffe60);
  LogicalType::~LogicalType((LogicalType *)0x1a3f099);
  DataChunk::DataChunk((DataChunk *)in_stack_fffffffffffffe30);
  SelectionVector::SelectionVector((SelectionVector *)0x1a3f0d3);
  in_RDI[0x34] = 0;
  vector<duckdb::FrameBounds,_true>::vector((vector<duckdb::FrameBounds,_true> *)0x1a3f0fc);
  LogicalType::LogicalType(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4f);
  Vector::Vector(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                 (idx_t)in_stack_fffffffffffffe60);
  LogicalType::~LogicalType((LogicalType *)0x1a3f14f);
  unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::unique_ptr
            ((unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true> *)
             0x1a3f16b);
  unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::unique_ptr
            ((unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true> *)
             0x1a3f187);
  DataChunk::DataChunk((DataChunk *)in_stack_fffffffffffffe30);
  DataChunk::DataChunk((DataChunk *)in_stack_fffffffffffffe30);
  SelectionVector::SelectionVector((SelectionVector *)0x1a3f1d9);
  this_01 = (RowLayout *)(in_RDI + 0x5a);
  RowLayout::RowLayout(in_stack_fffffffffffffe30);
  WindowAggregatorLocalState::InitSubFrames((SubFrames *)in_stack_fffffffffffffe60,exclude_mode);
  SelectionVector::Initialize(in_stack_fffffffffffffe40,(idx_t)in_stack_fffffffffffffe38);
  local_78 = (allocate_function_ptr_t)
             std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1a3f246);
  Vector::SetVectorType(in_stack_fffffffffffffe60,exclude_mode);
  Vector::Flatten(in_stack_000001e0,in_stack_000001d8);
  allocator = (Allocator *)FlatVector::GetData<unsigned_char*>((Vector *)0x1a3f28f);
  for (local_88 = 0; local_88 < 0x800; local_88 = local_88 + 1) {
    (&allocator->allocate_function)[local_88] = local_78;
    local_78 = local_78 + *(long *)(in_RDI[0xb] + 0x1a0);
  }
  local_80 = allocator;
  bVar2 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffffe40);
  if (!bVar2) {
    bVar2 = ::std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>
                        *)0x1a3f4dc);
    if (!bVar2) {
      this_00 = (DataChunk *)(in_RDI + 0x4f);
      types = Allocator::DefaultAllocator();
      LogicalType::LogicalType(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4f);
      local_b0 = (undefined1 **)local_c8;
      local_a8 = 1;
      ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x1a3f54d);
      iVar1._M_len = (size_type)in_stack_fffffffffffffe40;
      iVar1._M_array = in_stack_fffffffffffffe38;
      vector<duckdb::LogicalType,_true>::vector
                (&in_stack_fffffffffffffe30->types,iVar1,in_stack_fffffffffffffe28);
      DataChunk::Initialize
                ((DataChunk *)this_01,allocator,(vector<duckdb::LogicalType,_true> *)types,
                 (idx_t)this_00);
      vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x1a3f59c);
      ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x1a3f5a9)
      ;
      pppuVar4 = (undefined1 ***)local_c8;
      pppuVar3 = &local_b0;
      do {
        pppuVar3 = pppuVar3 + -3;
        LogicalType::~LogicalType((LogicalType *)0x1a3f5d2);
        align = (undefined1)((ulong)types >> 0x38);
      } while (pppuVar3 != pppuVar4);
      DataChunk::GetTypes(this_00);
      RowLayout::Initialize(this_01,(vector<duckdb::LogicalType,_true> *)allocator,(bool)align);
      vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x1a3f638);
      SelectionVector::Initialize(in_stack_fffffffffffffe40,(idx_t)in_stack_fffffffffffffe38);
    }
  }
  return;
}

Assistant:

WindowNaiveState::WindowNaiveState(const WindowNaiveAggregator &aggregator_p)
    : aggregator(aggregator_p), state(aggregator.state_size * STANDARD_VECTOR_SIZE), statef(LogicalType::POINTER),
      statep((LogicalType::POINTER)), flush_count(0), hashes(LogicalType::HASH) {
	InitSubFrames(frames, aggregator.exclude_mode);

	update_sel.Initialize();

	//	Build the finalise vector that just points to the result states
	data_ptr_t state_ptr = state.data();
	D_ASSERT(statef.GetVectorType() == VectorType::FLAT_VECTOR);
	statef.SetVectorType(VectorType::CONSTANT_VECTOR);
	statef.Flatten(STANDARD_VECTOR_SIZE);
	auto fdata = FlatVector::GetData<data_ptr_t>(statef);
	for (idx_t i = 0; i < STANDARD_VECTOR_SIZE; ++i) {
		fdata[i] = state_ptr;
		state_ptr += aggregator.state_size;
	}

	//	Initialise any ORDER BY data
	if (!aggregator.arg_order_idx.empty() && !arg_orderer) {
		orderby_payload.Initialize(Allocator::DefaultAllocator(), {LogicalType::UBIGINT});
		payload_layout.Initialize(orderby_payload.GetTypes());
		orderby_sel.Initialize();
	}
}